

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O2

void __thiscall ElfFile::loadElfHeader(ElfFile *this)

{
  ByteArray *this_00;
  byte *pbVar1;
  undefined8 uVar2;
  int iVar3;
  Elf32_Word EVar4;
  Elf32_Addr EVar5;
  Elf32_Off EVar6;
  Endianness endianness;
  
  this_00 = &this->fileData;
  pbVar1 = (this->fileData).data_;
  uVar2 = *(undefined8 *)(pbVar1 + 8);
  *(undefined8 *)(this->fileHeader).e_ident = *(undefined8 *)pbVar1;
  *(undefined8 *)((this->fileHeader).e_ident + 8) = uVar2;
  endianness = (Endianness)((this->fileHeader).e_ident[5] != '\x02');
  iVar3 = ByteArray::getWord(this_00,0x10,endianness);
  (this->fileHeader).e_type = (Elf32_Half)iVar3;
  iVar3 = ByteArray::getWord(this_00,0x12,endianness);
  (this->fileHeader).e_machine = (Elf32_Half)iVar3;
  EVar4 = ByteArray::getDoubleWord(this_00,0x14,endianness);
  (this->fileHeader).e_version = EVar4;
  EVar5 = ByteArray::getDoubleWord(this_00,0x18,endianness);
  (this->fileHeader).e_entry = EVar5;
  EVar6 = ByteArray::getDoubleWord(this_00,0x1c,endianness);
  (this->fileHeader).e_phoff = EVar6;
  EVar6 = ByteArray::getDoubleWord(this_00,0x20,endianness);
  (this->fileHeader).e_shoff = EVar6;
  EVar4 = ByteArray::getDoubleWord(this_00,0x24,endianness);
  (this->fileHeader).e_flags = EVar4;
  iVar3 = ByteArray::getWord(this_00,0x28,endianness);
  (this->fileHeader).e_ehsize = (Elf32_Half)iVar3;
  iVar3 = ByteArray::getWord(this_00,0x2a,endianness);
  (this->fileHeader).e_phentsize = (Elf32_Half)iVar3;
  iVar3 = ByteArray::getWord(this_00,0x2c,endianness);
  (this->fileHeader).e_phnum = (Elf32_Half)iVar3;
  iVar3 = ByteArray::getWord(this_00,0x2e,endianness);
  (this->fileHeader).e_shentsize = (Elf32_Half)iVar3;
  iVar3 = ByteArray::getWord(this_00,0x30,endianness);
  (this->fileHeader).e_shnum = (Elf32_Half)iVar3;
  iVar3 = ByteArray::getWord(this_00,0x32,endianness);
  (this->fileHeader).e_shstrndx = (Elf32_Half)iVar3;
  return;
}

Assistant:

void ElfFile::loadElfHeader()
{
	memcpy(fileHeader.e_ident, &fileData[0], sizeof(fileHeader.e_ident));
	Endianness endianness = getEndianness();
	fileHeader.e_type = fileData.getWord(0x10, endianness);
	fileHeader.e_machine = fileData.getWord(0x12, endianness);
	fileHeader.e_version = fileData.getDoubleWord(0x14, endianness);
	fileHeader.e_entry = fileData.getDoubleWord(0x18, endianness);
	fileHeader.e_phoff = fileData.getDoubleWord(0x1C, endianness);
	fileHeader.e_shoff = fileData.getDoubleWord(0x20, endianness);
	fileHeader.e_flags = fileData.getDoubleWord(0x24, endianness);
	fileHeader.e_ehsize = fileData.getWord(0x28, endianness);
	fileHeader.e_phentsize = fileData.getWord(0x2A, endianness);
	fileHeader.e_phnum = fileData.getWord(0x2C, endianness);
	fileHeader.e_shentsize = fileData.getWord(0x2E, endianness);
	fileHeader.e_shnum = fileData.getWord(0x30, endianness);
	fileHeader.e_shstrndx = fileData.getWord(0x32, endianness);
}